

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ConcatLayerParams::_InternalParse
          (ConcatLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  uint uVar3;
  pair<const_char_*,_unsigned_int> pVar4;
  pair<const_char_*,_unsigned_long> pVar5;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar1 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar1) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      uVar3 = (uint)*local_30;
      p = local_30 + 1;
      if ((char)*local_30 < '\0') {
        uVar3 = (uVar3 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar4 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar3);
          p = (byte *)pVar4.first;
          uVar3 = pVar4.second;
        }
        else {
          p = local_30 + 2;
        }
        if (uVar3 != 800) goto LAB_0027015d;
        uVar2 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar2 < 0) {
          uVar3 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_30) {
            uVar2 = (ulong)uVar3;
            local_30 = p + 2;
            goto LAB_00270206;
          }
          local_30 = p;
          pVar5 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar3);
          local_30 = (byte *)pVar5.first;
          this->sequenceconcat_ = pVar5.second != 0;
          goto LAB_0027019d;
        }
LAB_00270206:
        this->sequenceconcat_ = uVar2 != 0;
      }
      else {
LAB_0027015d:
        if ((uVar3 == 0) || ((uVar3 & 7) == 4)) {
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar3 - 1;
          return (char *)p;
        }
        uVar2 = this_00->ptr_;
        local_30 = p;
        if ((uVar2 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar2 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar3,unknown,(char *)local_30,ctx);
LAB_0027019d:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar1 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar1);
  }
  return (char *)local_30;
}

Assistant:

const char* ConcatLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // bool sequenceConcat = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 32)) {
          sequenceconcat_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}